

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O2

size_t anurbs::HilbertCurve<3L>::index_at(size_t m,VectorU *p)

{
  CoeffReturnType puVar1;
  size_t sVar2;
  ulong uVar3;
  ulong d;
  size_t sVar4;
  size_t x;
  long index;
  ulong i;
  ulong e;
  
  d = 0;
  e = 0;
  sVar2 = 0;
  while (m = m - 1, -1 < (long)m) {
    sVar4 = 0;
    for (index = 0; index != 3; index = index + 1) {
      puVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>,_0> *)p,index
                         );
      sVar4 = sVar4 + ((ulong)((*puVar1 >> (m & 0x3f) & 1) != 0) << ((byte)index & 0x3f));
    }
    sVar4 = t(e,d,sVar4);
    uVar3 = sVar4 >> 1 ^ sVar4 >> 2;
    i = uVar3 ^ sVar4;
    x = i - 1 >> 1 ^ i - 1 & 0xfffffffffffffffe;
    if (uVar3 == sVar4) {
      x = 0;
    }
    sVar4 = rol(x,d + 1);
    e = e ^ sVar4;
    sVar4 = HilbertCurve<3L>::d(i);
    d = (sVar4 + d + 1) % 3;
    sVar2 = sVar2 << 3 | i;
  }
  return sVar2;
}

Assistant:

static size_t index_at(const size_t m, const VectorU p) noexcept
    {
        // FIXME: check m

        size_t h = 0;
        size_t ve = 0;
        size_t vd = 0;

        for (Index i = m - 1; i > -1; i--) {
            size_t s = 0;

            for (Index j = 0; j < TDimension; j++) {
                s += bit(p[j], i) << j;
            }

            const size_t l = t(ve, vd, s);
            const size_t w = inverse_gc(l);

            ve = ve ^ (rol(e(w), vd + 1));
            vd = (vd + d(w) + 1) % TDimension;
            h = (h << TDimension) | w;
        }

        return h;
    }